

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_4::anon_unknown_0::readCoreTiledPart
               (exr_context_t f,int part,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  long lVar2;
  byte in_CL;
  byte in_DL;
  undefined4 in_ESI;
  undefined8 in_RDI;
  bool bVar3;
  exr_coding_channel_info_t *outc_1;
  int c_1;
  uint8_t *dptr;
  exr_coding_channel_info_t *outc;
  int c;
  uint64_t bytes;
  int64_t curx;
  int64_t cury;
  int ty;
  int tx;
  exr_decode_pipeline_t decoder;
  exr_chunk_info_t cinfo;
  bool doread;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tiledata;
  int32_t curth;
  int32_t curtw;
  int32_t levh;
  int32_t levw;
  int32_t xlevel;
  int32_t ylevel;
  bool keepgoing;
  int32_t levelsy;
  int32_t levelsx;
  exr_tile_round_mode_t roundingmode;
  exr_tile_level_mode_t levelmode;
  uint32_t tysz;
  uint32_t txsz;
  exr_attr_box2i_t datawin;
  exr_result_t frv;
  exr_result_t rv;
  int in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce4;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  size_type in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  reference local_308;
  int local_2f4;
  ulong local_2f0;
  long local_2d8;
  long local_2d0;
  int local_2c8;
  int local_2c4;
  undefined8 local_2c0;
  long local_2b8;
  short local_2b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_250;
  code *local_1c8;
  undefined1 local_c8 [22];
  char local_b2;
  byte local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  byte local_49;
  int local_48;
  int local_44;
  undefined1 local_40 [4];
  int local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  undefined1 local_30 [16];
  int local_20;
  int local_1c;
  byte local_16;
  byte local_15;
  undefined4 local_14;
  undefined8 local_10;
  bool local_1;
  
  local_15 = in_DL & 1;
  local_16 = in_CL & 1;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_1c = exr_get_data_window(in_RDI,in_ESI,local_30);
  if (local_1c == 0) {
    local_1c = exr_get_tile_descriptor(local_10,local_14,local_34,local_38,&local_3c,local_40);
    if (local_1c == 0) {
      iVar1 = exr_get_tile_levels(local_10,local_14,&local_44,&local_48);
      if (iVar1 == 0) {
        local_49 = 1;
        local_20 = 0;
        local_1c = 0;
        for (local_50 = 0; uVar6 = (local_49 & 1) != 0 && local_50 < local_48, (bool)uVar6;
            local_50 = local_50 + 1) {
          for (local_54 = 0; bVar3 = (local_49 & 1) != 0, uVar5 = bVar3 && local_54 < local_44,
              bVar3 && local_54 < local_44; local_54 = local_54 + 1) {
            local_1c = exr_get_level_sizes(local_10,local_14,local_54,local_50,&local_58,&local_5c);
            if (local_1c == 0) {
              local_1c = exr_get_tile_sizes(local_10,local_14,local_54,local_50,&local_60,&local_64)
              ;
              if (local_1c == 0) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117806);
                local_81 = 0;
                memset(&local_2c0,0,0x1f8);
                local_2c0 = 0x1f8;
                local_2c8 = 0;
                for (local_2d0 = 0; bVar3 = (local_49 & 1) != 0,
                    uVar4 = bVar3 && local_2d0 < local_5c, bVar3 && local_2d0 < local_5c;
                    local_2d0 = local_64 + local_2d0) {
                  local_2c4 = 0;
                  for (local_2d8 = 0; bVar3 = (local_49 & 1) != 0,
                      in_stack_fffffffffffffce4 = bVar3 && local_2d8 < local_58,
                      bVar3 && local_2d8 < local_58; local_2d8 = local_60 + local_2d8) {
                    in_stack_fffffffffffffce0 =
                         exr_read_tile_chunk_info
                                   (local_10,local_14,local_2c4,local_2c8,local_54,local_50,local_c8
                                   );
                    local_1c = in_stack_fffffffffffffce0;
                    if (in_stack_fffffffffffffce0 == 0) {
                      if (local_2b8 == 0) {
                        local_1c = exr_decoding_initialize(local_10,local_14,local_c8,&local_2c0);
                        if (local_1c != 0) {
                          local_49 = 0;
                          local_20 = local_1c;
                          break;
                        }
                        local_2f0 = 0;
                        for (local_2f4 = 0; local_2f4 < local_2b0; local_2f4 = local_2f4 + 1) {
                          lVar2 = local_2b8 + (long)local_2f4 * 0x30;
                          *(ulong *)(lVar2 + 0x28) = local_2f0 + 0x1000;
                          *(int *)(lVar2 + 0x20) = (int)*(short *)(lVar2 + 0x1c);
                          *(int *)(lVar2 + 0x24) = *(int *)(lVar2 + 0x20) * local_60;
                          local_2f0 = (long)local_60 * (long)*(short *)(lVar2 + 0x1c) *
                                      (long)local_64 + local_2f0;
                        }
                        local_81 = 1;
                        if (((local_15 & 1) != 0) && (999999 < local_2f0)) {
                          local_81 = 0;
                        }
                        if (local_b2 == '\x03') {
                          local_250 = &local_80;
                          local_1c8 = realloc_deepdata;
                        }
                        else if (local_81 != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                     in_stack_fffffffffffffce8);
                        }
                        local_1c = exr_decoding_choose_default_routines
                                             (local_10,local_14,&local_2c0);
                        if (local_1c != 0) {
                          local_49 = 0;
                          local_20 = local_1c;
                          break;
                        }
                      }
                      else {
                        local_1c = exr_decoding_update(local_10,local_14,local_c8,&local_2c0);
                        if (local_1c != 0) {
                          local_20 = local_1c;
                          if ((local_16 & 1) == 0) goto LAB_00117cf2;
                          local_49 = 0;
                          break;
                        }
                      }
                      if ((local_81 & 1) != 0) {
                        if (local_b2 != '\x03') {
                          local_308 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      operator[](&local_80,0);
                          for (in_stack_fffffffffffffcf4 = 0; in_stack_fffffffffffffcf4 < local_2b0;
                              in_stack_fffffffffffffcf4 = in_stack_fffffffffffffcf4 + 1) {
                            in_stack_fffffffffffffce8 =
                                 local_2b8 + (long)in_stack_fffffffffffffcf4 * 0x30;
                            *(reference *)(in_stack_fffffffffffffce8 + 0x28) = local_308;
                            *(int *)(in_stack_fffffffffffffce8 + 0x20) =
                                 (int)*(short *)(in_stack_fffffffffffffce8 + 0x1c);
                            *(int *)(in_stack_fffffffffffffce8 + 0x24) =
                                 *(int *)(in_stack_fffffffffffffce8 + 0x20) * local_60;
                            local_308 = local_308 +
                                        (long)local_60 *
                                        (long)*(short *)(in_stack_fffffffffffffce8 + 0x1c) *
                                        (long)local_64;
                          }
                        }
                        local_1c = exr_decoding_run(local_10,local_14,&local_2c0);
                        if ((local_1c != 0) && (local_20 = local_1c, (local_16 & 1) != 0)) {
                          local_49 = 0;
                          break;
                        }
                      }
                    }
                    else {
                      if ((local_3c == 2) || (local_54 == local_50)) {
                        local_20 = in_stack_fffffffffffffce0;
                      }
                      if ((local_16 & 1) != 0) {
                        local_49 = 0;
                        break;
                      }
                    }
LAB_00117cf2:
                    local_2c4 = local_2c4 + 1;
                  }
                  local_2c8 = local_2c8 + 1;
                }
                exr_decoding_destroy(local_10,&local_2c0);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0)))));
              }
              else {
                if ((local_3c == 2) || (local_54 == local_50)) {
                  local_20 = local_1c;
                }
                if ((local_16 & 1) != 0) {
                  local_49 = 0;
                  break;
                }
              }
            }
            else {
              if ((local_3c == 2) || (local_54 == local_50)) {
                local_20 = local_1c;
              }
              if ((local_16 & 1) != 0) {
                local_49 = 0;
                break;
              }
            }
          }
        }
        local_1 = local_20 != 0;
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
readCoreTiledPart (
    exr_context_t f, int part, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv, frv;

    exr_attr_box2i_t datawin;
    rv = exr_get_data_window (f, part, &datawin);
    if (rv != EXR_ERR_SUCCESS) return true;

    uint32_t              txsz, tysz;
    exr_tile_level_mode_t levelmode;
    exr_tile_round_mode_t roundingmode;

    rv = exr_get_tile_descriptor (
        f, part, &txsz, &tysz, &levelmode, &roundingmode);
    if (rv != EXR_ERR_SUCCESS) return true;

    int32_t levelsx, levelsy;
    rv = exr_get_tile_levels (f, part, &levelsx, &levelsy);
    if (rv != EXR_ERR_SUCCESS) return true;

    frv            = rv;
    bool keepgoing = true;
    for (int32_t ylevel = 0; keepgoing && ylevel < levelsy; ++ylevel)
    {
        for (int32_t xlevel = 0; keepgoing && xlevel < levelsx; ++xlevel)
        {
            int32_t levw, levh;
            rv = exr_get_level_sizes (f, part, xlevel, ylevel, &levw, &levh);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                    frv = rv;
                if (reduceTime)
                {
                    keepgoing = false;
                    break;
                }
                continue;
            }

            int32_t curtw, curth;
            rv = exr_get_tile_sizes (f, part, xlevel, ylevel, &curtw, &curth);
            if (rv != EXR_ERR_SUCCESS)
            {
                if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                    frv = rv;
                if (reduceTime)
                {
                    keepgoing = false;
                    break;
                }
                continue;
            }

            // we could make this over all levels but then would have to
            // re-check the allocation size, let's leave it here to check when
            // tile size is < full / top level tile size
            std::vector<uint8_t>  tiledata;
            bool                  doread = false;
            exr_chunk_info_t      cinfo;
            exr_decode_pipeline_t decoder = EXR_DECODE_PIPELINE_INITIALIZER;

            int tx, ty;
            ty = 0;
            for (int64_t cury = 0; keepgoing && cury < levh;
                 cury += curth, ++ty)
            {
                tx = 0;
                for (int64_t curx = 0; keepgoing && curx < levw;
                     curx += curtw, ++tx)
                {
                    rv = exr_read_tile_chunk_info (
                        f, part, tx, ty, xlevel, ylevel, &cinfo);
                    if (rv != EXR_ERR_SUCCESS)
                    {
                        if (levelmode == EXR_TILE_RIPMAP_LEVELS || xlevel == ylevel)
                            frv = rv;
                        if (reduceTime)
                        {
                            keepgoing = false;
                            break;
                        }
                        continue;
                    }

                    if (decoder.channels == NULL)
                    {
                        rv =
                            exr_decoding_initialize (f, part, &cinfo, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv       = rv;
                            keepgoing = false;
                            break;
                        }

                        uint64_t bytes = 0;
                        for (int c = 0; c < decoder.channel_count; c++)
                        {
                            exr_coding_channel_info_t& outc =
                                decoder.channels[c];
                            // fake addr for default routines
                            outc.decode_to_ptr = (uint8_t*) 0x1000 + bytes;
                            outc.user_pixel_stride =
                                outc.user_bytes_per_element;
                            outc.user_line_stride =
                                outc.user_pixel_stride * curtw;
                            bytes += (uint64_t) curtw *
                                     (uint64_t) outc.user_bytes_per_element *
                                     (uint64_t) curth;
                        }

                        doread = true;
                        if (reduceMemory && bytes >= gMaxTileBytes)
                            doread = false;

                        if (cinfo.type == EXR_STORAGE_DEEP_TILED)
                        {
                            decoder.decoding_user_data = &tiledata;
                            decoder.realloc_nonimage_data_fn =
                                &realloc_deepdata;
                        }
                        else
                        {
                            if (doread) tiledata.resize (bytes);
                        }
                        rv = exr_decoding_choose_default_routines (
                            f, part, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv       = rv;
                            keepgoing = false;
                            break;
                        }
                    }
                    else
                    {
                        rv = exr_decoding_update (f, part, &cinfo, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv = rv;
                            if (reduceTime)
                            {
                                keepgoing = false;
                                break;
                            }
                            continue;
                        }
                    }

                    if (doread)
                    {
                        if (cinfo.type != EXR_STORAGE_DEEP_TILED)
                        {
                            uint8_t* dptr = &(tiledata[0]);
                            for (int c = 0; c < decoder.channel_count; c++)
                            {
                                exr_coding_channel_info_t& outc =
                                    decoder.channels[c];
                                outc.decode_to_ptr = dptr;
                                outc.user_pixel_stride =
                                    outc.user_bytes_per_element;
                                outc.user_line_stride =
                                    outc.user_pixel_stride * curtw;
                                dptr += (uint64_t) curtw *
                                        (uint64_t) outc.user_bytes_per_element *
                                        (uint64_t) curth;
                            }
                        }

                        rv = exr_decoding_run (f, part, &decoder);
                        if (rv != EXR_ERR_SUCCESS)
                        {
                            frv = rv;
                            if (reduceTime)
                            {
                                keepgoing = false;
                                break;
                            }
                        }
                    }
                }
            }

            exr_decoding_destroy (f, &decoder);
        }
    }

    return (frv != EXR_ERR_SUCCESS);
}